

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_posix_file_storage.cpp
# Opt level: O0

void __thiscall cppcms::sessions::session_file_storage::gc(session_file_storage *this)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  long lVar7;
  DIR *__lhs;
  int *piVar8;
  undefined8 uVar9;
  bool in_stack_0000002f;
  string *in_stack_00000030;
  session_file_storage *in_stack_00000038;
  locked_file *in_stack_00000040;
  locked_file file;
  string sid;
  int i;
  int err;
  int path_len;
  dirent *entry_p;
  dirent *entry_st;
  DIR *d;
  locked_file *in_stack_fffffffffffffe88;
  int in_stack_fffffffffffffea4;
  uint in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffed0;
  string local_118 [24];
  string *in_stack_ffffffffffffff00;
  string local_f8 [4];
  int in_stack_ffffffffffffff0c;
  cppcms_error *in_stack_ffffffffffffff10;
  locked_file local_d8;
  allocator local_81;
  string local_80 [32];
  int local_60;
  undefined1 local_59;
  int local_38;
  int local_24;
  dirent *local_20;
  dirent *local_18;
  DIR *local_10;
  
  local_10 = (DIR *)0x0;
  local_18 = (dirent *)0x0;
  pcVar6 = (char *)std::__cxx11::string::c_str();
  lVar7 = pathconf(pcVar6,3);
  local_24 = (int)lVar7;
  if (local_24 < 0) {
    local_24 = 0xff;
  }
  local_18 = (dirent *)operator_new__((long)local_24 + 0x119);
  pcVar6 = (char *)std::__cxx11::string::c_str();
  __lhs = opendir(pcVar6);
  local_10 = __lhs;
  if (__lhs != (DIR *)0x0) {
    while( true ) {
      iVar3 = readdir_r(local_10,local_18,&local_20);
      uVar1 = in_stack_fffffffffffffec0 & 0xffffff;
      if (iVar3 == 0) {
        uVar1 = CONCAT13(local_20 != (dirent *)0x0,(int3)in_stack_fffffffffffffec0);
      }
      in_stack_fffffffffffffec0 = uVar1;
      if ((char)(in_stack_fffffffffffffec0 >> 0x18) == '\0') break;
      local_60 = 0;
      while ((local_60 < 0x20 && (iVar4 = isxdigit((int)local_18->d_name[local_60]), iVar4 != 0))) {
        local_60 = local_60 + 1;
      }
      if ((local_60 == 0x20) && (local_18->d_name[0x20] == '\0')) {
        pcVar6 = local_18->d_name;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_80,pcVar6,&local_81);
        std::allocator<char>::~allocator((allocator<char> *)&local_81);
        std::__cxx11::string::string(local_f8,local_80);
        locked_file::locked_file
                  (in_stack_00000040,in_stack_00000038,in_stack_00000030,in_stack_0000002f);
        std::__cxx11::string::~string(local_f8);
        iVar4 = locked_file::fd(&local_d8);
        if (-1 < iVar4) {
          iVar5 = locked_file::fd(&local_d8);
          bVar2 = read_timestamp((session_file_storage *)CONCAT44(iVar4,iVar5),
                                 in_stack_fffffffffffffea4);
          in_stack_fffffffffffffea4 = CONCAT13(bVar2,(int3)in_stack_fffffffffffffea4);
          if (!bVar2) {
            locked_file::name_abi_cxx11_(in_stack_fffffffffffffe88);
            pcVar6 = (char *)std::__cxx11::string::c_str();
            unlink(pcVar6);
            std::__cxx11::string::~string(local_118);
          }
        }
        locked_file::~locked_file((locked_file *)CONCAT44(iVar3,in_stack_fffffffffffffec0));
        std::__cxx11::string::~string(local_80);
      }
    }
    closedir(local_10);
    if (local_18 != (dirent *)0x0) {
      operator_delete__(local_18);
    }
    return;
  }
  piVar8 = __errno_location();
  local_38 = *piVar8;
  local_59 = 1;
  uVar9 = __cxa_allocate_exception(0x30);
  std::operator+((char *)__lhs,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(local_38,in_stack_fffffffffffffed0));
  cppcms_error::cppcms_error
            (in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c,in_stack_ffffffffffffff00);
  local_59 = 0;
  __cxa_throw(uVar9,&cppcms_error::typeinfo,cppcms_error::~cppcms_error);
}

Assistant:

void session_file_storage::gc()
{
	DIR *d=0;
	struct dirent *entry_st=0,*entry_p;
	int path_len=pathconf(path_.c_str(),_PC_NAME_MAX);
	if(path_len < 0 ) { 
		// Only "sessions" should be in this directory
		// also this directory has high level of trust
		// thus... Don't care about symlink exploits
		#ifdef NAME_MAX
		path_len=NAME_MAX;
		#elif defined(PATH_MAX)
		path_len=PATH_MAX;
		#else
		path_len=4096; // guess
		#endif
	}
	// this is for Solaris... 
	entry_st=(struct dirent *)new char[sizeof(struct dirent)+path_len+1];
	try{
		if((d=::opendir(path_.c_str()))==NULL) {
			int err=errno;
			throw cppcms_error(err,"Failed to open directory :"+path_);
		}
		while(::readdir_r(d,entry_st,&entry_p)==0 && entry_p!=NULL) {
			int i;
			for(i=0;i<32;i++) {
				if(!isxdigit(entry_st->d_name[i]))
					break;
			}
			if(i!=32 || entry_st->d_name[i]!=0) 
				continue;
			std::string sid=entry_st->d_name;
			{
				locked_file file(this,sid,false);
				if(file.fd() >=0 && !read_timestamp(file.fd()))
					::unlink(file.name().c_str());
			}
		}
		::closedir(d);
	}
	catch(...) {
		if(d) ::closedir(d);
		delete [] entry_st;
		throw;
	}
	delete [] entry_st;
}